

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

PClassActor * FState::StaticFindStateOwner(FState *state)

{
  PClassActor *pPVar1;
  uint uVar2;
  PClassActor **ppPVar3;
  PClassActor *info;
  uint i;
  FState *state_local;
  
  info._4_4_ = 0;
  while( true ) {
    uVar2 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses);
    if (uVar2 <= info._4_4_) {
      return (PClassActor *)0x0;
    }
    ppPVar3 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                        (&PClassActor::AllActorClasses,(ulong)info._4_4_);
    pPVar1 = *ppPVar3;
    if ((pPVar1->OwnedStates <= state) && (state < pPVar1->OwnedStates + pPVar1->NumOwnedStates))
    break;
    info._4_4_ = info._4_4_ + 1;
  }
  return pPVar1;
}

Assistant:

PClassActor *FState::StaticFindStateOwner (const FState *state)
{
	for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
	{
		PClassActor *info = PClassActor::AllActorClasses[i];
		if (state >= info->OwnedStates &&
			state <  info->OwnedStates + info->NumOwnedStates)
		{
			return info;
		}
	}

	return NULL;
}